

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void dc_store_64xh(__m128i *row,int height,uint8_t *dst,ptrdiff_t stride)

{
  longlong lVar1;
  longlong lVar2;
  int iVar3;
  longlong *plVar4;
  bool bVar5;
  
  iVar3 = 0;
  if (0 < height) {
    iVar3 = height;
  }
  plVar4 = (longlong *)(dst + 0x30);
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    lVar1 = (*row)[0];
    lVar2 = (*row)[1];
    plVar4[-6] = lVar1;
    plVar4[-5] = lVar2;
    plVar4[-4] = lVar1;
    plVar4[-3] = lVar2;
    lVar1 = (*row)[0];
    lVar2 = (*row)[1];
    plVar4[-2] = lVar1;
    plVar4[-1] = lVar2;
    *plVar4 = lVar1;
    plVar4[1] = lVar2;
    plVar4 = (longlong *)((long)plVar4 + stride);
  }
  return;
}

Assistant:

static inline void dc_store_64xh(const __m128i *row, int height, uint8_t *dst,
                                 ptrdiff_t stride) {
  for (int i = 0; i < height; ++i) {
    _mm_store_si128((__m128i *)dst, *row);
    _mm_store_si128((__m128i *)(dst + 16), *row);
    _mm_store_si128((__m128i *)(dst + 32), *row);
    _mm_store_si128((__m128i *)(dst + 48), *row);
    dst += stride;
  }
}